

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThrowStatement.h
# Opt level: O2

void __thiscall ThrowStatement::execute(ThrowStatement *this,Environment *env)

{
  element_type *peVar1;
  ThrowPacket *this_00;
  ptr<Value> toThrow;
  __shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  peVar1 = (this->expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    toThrow.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    toThrow.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    (**peVar1->_vptr_Expression)(&toThrow,peVar1,env);
  }
  this_00 = (ThrowPacket *)__cxa_allocate_exception(0x10);
  std::__shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,&toThrow.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>);
  ThrowPacket::ThrowPacket(this_00,(ptr<Value> *)&local_28);
  __cxa_throw(this_00,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

void execute(Environment *env) override {
        ptr<Value> toThrow = expression ? expression->evaluate(env) : nullptr;
        throw ThrowPacket(toThrow);
    }